

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagemap.h
# Opt level: O3

bool __thiscall TCMalloc_PageMap2<35>::Ensure(TCMalloc_PageMap2<35> *this,Number start,size_t n)

{
  Leaf *__s;
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (n + start) - 1;
  if (0x7ffffffff < start || uVar1 < start) {
    return uVar1 < start;
  }
  while( true ) {
    if (this->root_[start >> 0x12] == (Leaf *)0x0) {
      __s = (Leaf *)(*this->allocator_)(0x200000);
      if (__s == (Leaf *)0x0) {
        return false;
      }
      memset(__s,0,0x200000);
      this->root_[start >> 0x12] = __s;
    }
    uVar2 = start & 0x7fffc0000;
    start = uVar2 + 0x40000;
    if (uVar1 < start) break;
    if (uVar2 == 0x7fffc0000) {
      return uVar1 < start;
    }
  }
  return uVar1 < start;
}

Assistant:

bool Ensure(Number start, size_t n) {
    for (Number key = start; key <= start + n - 1; ) {
      const Number i1 = key >> LEAF_BITS;

      // Check for overflow
      if (i1 >= ROOT_LENGTH)
        return false;

      // Make 2nd level node if necessary
      if (root_[i1] == nullptr) {
        Leaf* leaf = reinterpret_cast<Leaf*>((*allocator_)(sizeof(Leaf)));
        if (leaf == nullptr) return false;
        memset(leaf, 0, sizeof(*leaf));
        root_[i1] = leaf;
      }

      // Advance key past whatever is covered by this leaf node
      key = ((key >> LEAF_BITS) + 1) << LEAF_BITS;
    }
    return true;
  }